

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

int __thiscall
slang::parsing::Trivia::clone
          (Trivia *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *pSVar1;
  SyntaxNode *node;
  
  if (this->kind - 7 < 2) {
    node = (this->field_0).syntaxNode;
    if ((char)__child_stack != '\0') {
      node = slang::syntax::deepClone(node,(BumpAllocator *)__fn);
    }
  }
  else if ((this->kind == SkippedTokens) || (this->hasFullLocation == false)) {
    node = *(SyntaxNode **)&this->field_0;
  }
  else {
    node = (SyntaxNode *)
           BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>((BumpAllocator *)__fn);
    pSVar1 = (SyntaxNode *)(((this->field_0).fullLocation)->text)._M_str;
    *(size_t *)node = (((this->field_0).fullLocation)->text)._M_len;
    node->parent = pSVar1;
    node->previewNode = ((this->field_0).syntaxNode)->previewNode;
  }
  return (int)node;
}

Assistant:

Trivia Trivia::clone(BumpAllocator& alloc, bool deep) const {
    Trivia result;
    result.kind = kind;
    result.hasFullLocation = hasFullLocation;

    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            if (deep)
                result.syntaxNode = syntax::deepClone(*syntaxNode, alloc);
            else
                result.syntaxNode = syntaxNode;
            break;
        case TriviaKind::SkippedTokens:
            result.tokens = tokens;
            break;
        default:
            if (hasFullLocation) {
                result.fullLocation = alloc.emplace<FullLocation>();
                result.fullLocation->text = fullLocation->text;
                result.fullLocation->location = fullLocation->location;
            }
            else {
                result.rawText = rawText;
            }
            break;
    }

    return result;
}